

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_padding.c
# Opt level: O0

void ihevc_pad_horz_chroma(UWORD8 *pu1_src,WORD32 src_strd,WORD32 ht,WORD32 wd,WORD32 pad_size)

{
  UWORD32 num_words;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  UWORD16 *in_RDI;
  int in_R8D;
  UWORD16 u2_uv_val;
  UWORD16 *pu2_src;
  WORD32 row;
  UWORD16 *local_28;
  int local_1c;
  
  num_words = in_R8D >> 1;
  local_28 = in_RDI;
  for (local_1c = 0; local_1c < in_EDX; local_1c = local_1c + 1) {
    ihevc_memset_16bit(local_28 + (int)-num_words,*local_28,num_words);
    ihevc_memset_16bit(local_28 + (in_ECX >> 1),local_28[(in_ECX >> 1) + -1],num_words);
    local_28 = local_28 + (in_ESI >> 1);
  }
  return;
}

Assistant:

void ihevc_pad_horz_chroma(UWORD8 *pu1_src,
                           WORD32 src_strd,
                           WORD32 ht,
                           WORD32 wd,
                           WORD32 pad_size)
{
    WORD32 row;
    //WORD32 col;
    UWORD16 *pu2_src = (UWORD16 *)pu1_src;

    src_strd >>= 1;
    wd >>= 1;
    pad_size >>= 1;

    for(row = 0; row < ht; row++)
    {
        UWORD16 u2_uv_val;

        u2_uv_val = pu2_src[0];
        ihevc_memset_16bit(&pu2_src[-pad_size], u2_uv_val, pad_size);

        u2_uv_val = pu2_src[wd - 1];
        ihevc_memset_16bit(&pu2_src[wd], u2_uv_val, pad_size);

        pu2_src += src_strd;
    }
}